

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
          (timestamp_t input)

{
  bool bVar1;
  date_t dVar2;
  timestamp_t tVar3;
  undefined1 auVar4 [16];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    dVar2.days = duckdb::Timestamp::GetDate(input);
    tVar3.value = duckdb::Timestamp::FromDatetime(dVar2,(dtime_t)0x0);
    return (timestamp_t)tVar3.value;
  }
  bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_40,false)
  ;
  if (bVar1) {
    return (timestamp_t)local_40.value;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
            (&local_38,(duckdb *)input.value,(timestamp_t)auVar4._8_8_);
  duckdb::InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_38);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}